

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::Event::~Event(Event *this)

{
  long in_FS_OFFSET;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  this->_vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_006dda40;
  this->live = 0;
  disarm(this);
  _kjCondition.value = (bool)(this->firing ^ 1);
  if (this->firing != false) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x881,FAILED,"!firing","_kjCondition,\"Promise callback destroyed itself.\"",
               &_kjCondition,(char (*) [35])"Promise callback destroyed itself.");
    Debug::Fault::fatal(&f);
  }
  if (*(long *)(in_FS_OFFSET + -0x30) == 0) {
    return;
  }
  AsyncObject::failed();
}

Assistant:

Event::~Event() noexcept {  // intentionally noexcept
  live = 0;

  // Prevent compiler from eliding this store above. This line probably isn't needed because there
  // are complex calls later in this destructor, and the compiler probably can't prove that they
  // won't come back and examine `live`, so it won't elide the write anyway. However, an
  // atomic_signal_fence is also sufficient to tell the compiler that a signal handler might access
  // `live`, so it won't optimize away the write. Note that a signal fence does not produce
  // any instructions, it just blocks compiler optimizations.
  std::atomic_signal_fence(std::memory_order_acq_rel);

  disarm();

  // If this fails, we'll abort due to `noexcept`. That's good because otherwise we're likely to
  // be in a use-after-free situation.
  KJ_REQUIRE(!firing, "Promise callback destroyed itself.");
}